

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpack.h
# Opt level: O2

int ahmedTest(void)

{
  zombie *this;
  warrior *Warrior;
  
  this = (zombie *)operator_new(0x28);
  zombie::zombie(this,3);
  Warrior = (warrior *)operator_new(0x58);
  derick::derick((derick *)Warrior);
  battle(Warrior,this);
  return 0;
}

Assistant:

int ahmedTest() {
    zombie *z = new zombie(3);
    derick *p = new derick;
    int test = battle(p, z);
    return 0;
}